

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

int If_ManSatFindCofigBits
              (void *pSat,Vec_Int_t *vPiVars,Vec_Int_t *vPoVars,word *pTruth,int nVars,word Perm,
              int nInps,Vec_Int_t *vValues)

{
  int iVar1;
  int local_88 [2];
  int pPerm [15];
  int i;
  int RetValue;
  word Perm_local;
  word *pwStack_30;
  int nVars_local;
  word *pTruth_local;
  Vec_Int_t *vPoVars_local;
  Vec_Int_t *vPiVars_local;
  void *pSat_local;
  
  _i = Perm;
  Perm_local._4_4_ = nVars;
  pwStack_30 = pTruth;
  pTruth_local = (word *)vPoVars;
  vPoVars_local = vPiVars;
  vPiVars_local = (Vec_Int_t *)pSat;
  if (0xf < nInps) {
    __assert_fail("nInps <= IF_MAX_FUNC_LUTSIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                  ,0x2be,
                  "int If_ManSatFindCofigBits(void *, Vec_Int_t *, Vec_Int_t *, word *, int, word, int, Vec_Int_t *)"
                 );
  }
  pPerm[0xe] = 0;
  while( true ) {
    if (nInps <= pPerm[0xe]) {
      iVar1 = Ifn_ManSatCheckOne((sat_solver *)vPiVars_local,(Vec_Int_t *)pTruth_local,pwStack_30,
                                 Perm_local._4_4_,local_88,nInps,vValues);
      Vec_IntClear(vValues);
      if (iVar1 != 0) {
        Ifn_ManSatDeriveOne((sat_solver *)vPiVars_local,vPoVars_local,vValues);
      }
      pSat_local._4_4_ = (uint)(iVar1 != 0);
      return pSat_local._4_4_;
    }
    iVar1 = Abc_TtGetHex((word *)&i,pPerm[0xe]);
    pPerm[(long)pPerm[0xe] + -2] = iVar1;
    if (Perm_local._4_4_ <= pPerm[(long)pPerm[0xe] + -2]) break;
    pPerm[0xe] = pPerm[0xe] + 1;
  }
  __assert_fail("pPerm[i] < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifTune.c"
                ,0x2c2,
                "int If_ManSatFindCofigBits(void *, Vec_Int_t *, Vec_Int_t *, word *, int, word, int, Vec_Int_t *)"
               );
}

Assistant:

int If_ManSatFindCofigBits( void * pSat, Vec_Int_t * vPiVars, Vec_Int_t * vPoVars, word * pTruth, int nVars, word Perm, int nInps, Vec_Int_t * vValues )
{
    // extract permutation
    int RetValue, i, pPerm[IF_MAX_FUNC_LUTSIZE];
    assert( nInps <= IF_MAX_FUNC_LUTSIZE );
    for ( i = 0; i < nInps; i++ )
    {
        pPerm[i] = Abc_TtGetHex( &Perm, i );
        assert( pPerm[i] < nVars );
    }
    // perform SAT check 
    RetValue = Ifn_ManSatCheckOne( (sat_solver *)pSat, vPoVars, pTruth, nVars, pPerm, nInps, vValues );
    Vec_IntClear( vValues );
    if ( RetValue == 0 )
        return 0;
    Ifn_ManSatDeriveOne( (sat_solver*)pSat, vPiVars, vValues );
    return 1;
}